

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O3

CURLcode rtsp_filter_rtp(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  anon_union_280_10_9f9d5394_for_proto *s;
  byte *pbVar1;
  byte bVar2;
  connectdata *pcVar3;
  void *pvVar4;
  int iVar5;
  CURLcode CVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  size_t sVar10;
  curl_write_callback p_Var11;
  ulong __n;
  size_t sVar12;
  bool bVar13;
  ulong uVar14;
  byte *__s1;
  
  pcVar3 = data->conn;
  *pconsumed = 0;
  if (blen != 0) {
    s = &pcVar3->proto;
    sVar12 = 0;
    do {
      bVar13 = true;
      if ((((data->req).headerline != 0) && ((*(byte *)((long)&pcVar3->proto + 0x34) & 1) == 0)) &&
         (lVar9 = (data->req).size, -1 < lVar9)) {
        bVar13 = lVar9 <= (data->req).bytecount;
      }
      switch((pcVar3->proto).rtspc.state) {
      case RTP_PARSE_SKIP:
        lVar9 = 0;
        uVar14 = 0;
        while (((byte *)buf)[uVar14] != 0x24) {
          if ((((byte *)buf)[uVar14] == 0x52 && !(bool)(bVar13 ^ 1)) &&
             ((data->set).rtspreq != RTSPREQ_RECEIVE)) {
            __s1 = (byte *)buf + uVar14;
            __n = blen + lVar9;
            if (4 < __n) {
              __n = 5;
            }
            iVar5 = strncmp((char *)__s1,"RTSP/",__n);
            if (iVar5 == 0) {
              (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
              pbVar1 = (byte *)((long)&pcVar3->proto + 0x34);
              *pbVar1 = *pbVar1 | 1;
              sVar12 = sVar12 + uVar14;
              goto LAB_0014c32a;
            }
          }
          *pconsumed = *pconsumed + 1;
          uVar14 = uVar14 + 1;
          lVar9 = lVar9 + -1;
          if (blen == uVar14) {
            __s1 = (byte *)buf + blen;
            sVar12 = sVar12 + blen;
            goto LAB_0014c32a;
          }
        }
        sVar12 = sVar12 + uVar14;
        if ((sVar12 != 0) &&
           (CVar6 = rtp_write_body_junk(data,(char *)((byte *)buf + uVar14 + -sVar12),sVar12),
           CVar6 != CURLE_OK)) {
          return CVar6;
        }
        CVar6 = Curl_dyn_addn((dynbuf *)&s->ftpc,(byte *)buf + uVar14,1);
        if (CVar6 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        *pconsumed = *pconsumed + 1;
        buf = (char *)((byte *)buf + uVar14);
        (pcVar3->proto).rtspc.state = RTP_PARSE_CHANNEL;
        sVar12 = 0;
        uVar14 = blen + ~uVar14;
        goto LAB_0014c298;
      case RTP_PARSE_CHANNEL:
        bVar2 = *buf;
        if (((data->state).rtp_channel_mask[bVar2 >> 3] >> (bVar2 & 7) & 1) == 0) {
          (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
          sVar7 = 1;
          if (*pconsumed == 0) {
            pcVar8 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
            CVar6 = rtp_write_body_junk(data,pcVar8,1);
            sVar7 = sVar12;
            if (CVar6 != CURLE_OK) {
              return CVar6;
            }
          }
          Curl_dyn_free((dynbuf *)&s->ftpc);
          sVar12 = sVar7;
          __s1 = (byte *)buf;
        }
        else {
          *(uint *)((long)&pcVar3->proto + 0x20) = (uint)bVar2;
          CVar6 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
          if (CVar6 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          *pconsumed = *pconsumed + 1;
          (pcVar3->proto).rtspc.state = RTP_PARSE_LEN;
LAB_0014c22b:
          blen = blen - 1;
          __s1 = (byte *)buf + 1;
        }
        break;
      case RTP_PARSE_LEN:
        sVar7 = Curl_dyn_len((dynbuf *)&s->ftpc);
        CVar6 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,1);
        if (CVar6 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        *pconsumed = *pconsumed + 1;
        uVar14 = blen - 1;
        if (sVar7 != 2) {
          pcVar8 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
          (pcVar3->proto).ftpc.pp.response.tv_sec =
               (ulong)(ushort)(*(ushort *)(pcVar8 + 2) << 8 | *(ushort *)(pcVar8 + 2) >> 8) + 4;
          (pcVar3->proto).rtspc.state = RTP_PARSE_DATA;
          goto LAB_0014c22b;
        }
LAB_0014c298:
        blen = uVar14;
        __s1 = (byte *)buf + 1;
        break;
      case RTP_PARSE_DATA:
        sVar7 = Curl_dyn_len((dynbuf *)&s->ftpc);
        uVar14 = (pcVar3->proto).ftpc.pp.response.tv_sec - sVar7;
        if (blen < uVar14) {
          CVar6 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,blen);
          if (CVar6 != CURLE_OK) {
            return CURLE_OUT_OF_MEMORY;
          }
          *pconsumed = *pconsumed + blen;
          __s1 = (byte *)buf + blen;
          goto LAB_0014c32a;
        }
        CVar6 = Curl_dyn_addn((dynbuf *)&s->ftpc,buf,uVar14);
        if (CVar6 != CURLE_OK) {
          return CURLE_OUT_OF_MEMORY;
        }
        *pconsumed = *pconsumed + uVar14;
        pcVar8 = Curl_dyn_ptr((dynbuf *)&s->ftpc);
        sVar7 = (pcVar3->proto).ftpc.pp.response.tv_sec;
        if (sVar7 == 0) {
          pcVar8 = "Cannot write a 0 size RTP packet.";
LAB_0014c3cd:
          Curl_failf(data,pcVar8);
          Curl_dyn_free((dynbuf *)&s->ftpc);
          (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
          return CURLE_WRITE_ERROR;
        }
        p_Var11 = (data->set).fwrite_rtp;
        lVar9 = 0x9f0;
        if (p_Var11 == (curl_write_callback)0x0) {
          p_Var11 = (data->set).fwrite_func;
          lVar9 = 0x1e8;
        }
        pvVar4 = *(void **)((long)&data->magic + lVar9);
        Curl_set_in_callback(data,true);
        sVar10 = (*p_Var11)(pcVar8,1,sVar7,pvVar4);
        Curl_set_in_callback(data,false);
        if (sVar10 == 0x10000001) {
          pcVar8 = "Cannot pause RTP";
          goto LAB_0014c3cd;
        }
        if (sVar10 != sVar7) {
          pcVar8 = "Failed writing RTP data";
          goto LAB_0014c3cd;
        }
        Curl_dyn_free((dynbuf *)&s->ftpc);
        (pcVar3->proto).rtspc.state = RTP_PARSE_SKIP;
        __s1 = (byte *)buf + uVar14;
        blen = blen - uVar14;
        break;
      default:
        return CURLE_RECV_ERROR;
      }
      buf = (char *)__s1;
    } while (blen != 0);
LAB_0014c32a:
    if (sVar12 != 0) {
      CVar6 = rtp_write_body_junk(data,(char *)(__s1 + -sVar12),sVar12);
      return CVar6;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode rtsp_filter_rtp(struct Curl_easy *data,
                                     const char *buf,
                                     size_t blen,
                                     size_t *pconsumed)
{
  struct rtsp_conn *rtspc = &(data->conn->proto.rtspc);
  CURLcode result = CURLE_OK;
  size_t skip_len = 0;

  *pconsumed = 0;
  while(blen) {
    bool in_body = (data->req.headerline && !rtspc->in_header) &&
                   (data->req.size >= 0) &&
                   (data->req.bytecount < data->req.size);
    switch(rtspc->state) {

    case RTP_PARSE_SKIP: {
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 0);
      while(blen && buf[0] != '$') {
        if(!in_body && buf[0] == 'R' &&
           data->set.rtspreq != RTSPREQ_RECEIVE) {
          if(strncmp(buf, "RTSP/", (blen < 5) ? blen : 5) == 0) {
            /* This could be the next response, no consume and return */
            if(*pconsumed) {
              DEBUGF(infof(data, "RTP rtsp_filter_rtp[SKIP] RTSP/ prefix, "
                           "skipping %zd bytes of junk", *pconsumed));
            }
            rtspc->state = RTP_PARSE_SKIP;
            rtspc->in_header = TRUE;
            goto out;
          }
        }
        /* junk/BODY, consume without buffering */
        *pconsumed += 1;
        ++buf;
        --blen;
        ++skip_len;
      }
      if(blen && buf[0] == '$') {
        /* possible start of an RTP message, buffer */
        if(skip_len) {
          /* end of junk/BODY bytes, flush */
          result = rtp_write_body_junk(data,
                                       (char *)(buf - skip_len), skip_len);
          skip_len = 0;
          if(result)
            goto out;
        }
        if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += 1;
        ++buf;
        --blen;
        rtspc->state = RTP_PARSE_CHANNEL;
      }
      break;
    }

    case RTP_PARSE_CHANNEL: {
      int idx = ((unsigned char)buf[0]) / 8;
      int off = ((unsigned char)buf[0]) % 8;
      DEBUGASSERT(Curl_dyn_len(&rtspc->buf) == 1);
      if(!(data->state.rtp_channel_mask[idx] & (1 << off))) {
        /* invalid channel number, junk or BODY data */
        rtspc->state = RTP_PARSE_SKIP;
        DEBUGASSERT(skip_len == 0);
        /* we do not consume this byte, it is BODY data */
        DEBUGF(infof(data, "RTSP: invalid RTP channel %d, skipping", idx));
        if(*pconsumed == 0) {
          /* We did not consume the initial '$' in our buffer, but had
           * it from an earlier call. We cannot un-consume it and have
           * to write it directly as BODY data */
          result = rtp_write_body_junk(data, Curl_dyn_ptr(&rtspc->buf), 1);
          if(result)
            goto out;
        }
        else {
          /* count the '$' as skip and continue */
          skip_len = 1;
        }
        Curl_dyn_free(&rtspc->buf);
        break;
      }
      /* a valid channel, so we expect this to be a real RTP message */
      rtspc->rtp_channel = (unsigned char)buf[0];
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      rtspc->state = RTP_PARSE_LEN;
      break;
    }

    case RTP_PARSE_LEN: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      const char *rtp_buf;
      DEBUGASSERT(rtp_len >= 2 && rtp_len < 4);
      if(Curl_dyn_addn(&rtspc->buf, buf, 1)) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
      *pconsumed += 1;
      ++buf;
      --blen;
      if(rtp_len == 2)
        break;
      rtp_buf = Curl_dyn_ptr(&rtspc->buf);
      rtspc->rtp_len = RTP_PKT_LENGTH(rtp_buf) + 4;
      rtspc->state = RTP_PARSE_DATA;
      break;
    }

    case RTP_PARSE_DATA: {
      size_t rtp_len = Curl_dyn_len(&rtspc->buf);
      size_t needed;
      DEBUGASSERT(rtp_len < rtspc->rtp_len);
      needed = rtspc->rtp_len - rtp_len;
      if(needed <= blen) {
        if(Curl_dyn_addn(&rtspc->buf, buf, needed)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += needed;
        buf += needed;
        blen -= needed;
        /* complete RTP message in buffer */
        DEBUGF(infof(data, "RTP write channel %d rtp_len %zu",
                     rtspc->rtp_channel, rtspc->rtp_len));
        result = rtp_client_write(data, Curl_dyn_ptr(&rtspc->buf),
                                  rtspc->rtp_len);
        Curl_dyn_free(&rtspc->buf);
        rtspc->state = RTP_PARSE_SKIP;
        if(result)
          goto out;
      }
      else {
        if(Curl_dyn_addn(&rtspc->buf, buf, blen)) {
          result = CURLE_OUT_OF_MEMORY;
          goto out;
        }
        *pconsumed += blen;
        buf += blen;
        blen = 0;
      }
      break;
    }

    default:
      DEBUGASSERT(0);
      return CURLE_RECV_ERROR;
    }
  }
out:
  if(!result && skip_len)
    result = rtp_write_body_junk(data, (char *)(buf - skip_len), skip_len);
  return result;
}